

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

void __thiscall
Js::FunctionExecutionStateMachine::CommitExecutedIterations
          (FunctionExecutionStateMachine *this,uint16 *limit,uint executedIterations)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 *puVar4;
  ushort local_2a;
  uint16 newCommittedProfiledIterations;
  uint16 clampedExecutedIterations;
  uint executedIterations_local;
  uint16 *limit_local;
  FunctionExecutionStateMachine *this_local;
  
  if ((this->initializedExecutionModeAndLimits & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x31e,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((((limit != &this->interpreterLimit) && (limit != &this->autoProfilingInterpreter0Limit)) &&
       (limit != &this->profilingInterpreter0Limit)) &&
      ((limit != &this->autoProfilingInterpreter1Limit && (limit != &this->simpleJitLimit)))) &&
     (limit != &this->profilingInterpreter1Limit)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x325,
                                "(&limit == &interpreterLimit || &limit == &autoProfilingInterpreter0Limit || &limit == &profilingInterpreter0Limit || &limit == &autoProfilingInterpreter1Limit || &limit == &simpleJitLimit || &limit == &profilingInterpreter1Limit)"
                                ,
                                "&limit == &interpreterLimit || &limit == &autoProfilingInterpreter0Limit || &limit == &profilingInterpreter0Limit || &limit == &autoProfilingInterpreter1Limit || &limit == &simpleJitLimit || &limit == &profilingInterpreter1Limit"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (executedIterations < *limit) {
    local_2a = (ushort)executedIterations;
  }
  else {
    local_2a = *limit;
  }
  if (this->fullJitThreshold < local_2a) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x328,"(fullJitThreshold >= clampedExecutedIterations)",
                                "fullJitThreshold >= clampedExecutedIterations");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->fullJitThreshold = this->fullJitThreshold - local_2a;
  *limit = *limit - local_2a;
  VerifyExecutionModeLimits(this);
  if (((limit == &this->profilingInterpreter0Limit) ||
      (((DAT_01eafdac & 1) == 0 && (limit == &this->simpleJitLimit)))) ||
     (limit == &this->profilingInterpreter1Limit)) {
    uVar3 = this->committedProfiledIterations + local_2a;
    if (uVar3 < this->committedProfiledIterations) {
      uVar3 = 0xffff;
    }
    this->committedProfiledIterations = uVar3;
  }
  return;
}

Assistant:

void FunctionExecutionStateMachine::CommitExecutedIterations(uint16 &limit, const uint executedIterations)
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(
            &limit == &interpreterLimit ||
            &limit == &autoProfilingInterpreter0Limit ||
            &limit == &profilingInterpreter0Limit ||
            &limit == &autoProfilingInterpreter1Limit ||
            &limit == &simpleJitLimit ||
            &limit == &profilingInterpreter1Limit);

        const uint16 clampedExecutedIterations = executedIterations >= limit ? limit : static_cast<uint16>(executedIterations);
        Assert(fullJitThreshold >= clampedExecutedIterations);
        fullJitThreshold -= clampedExecutedIterations;
        limit -= clampedExecutedIterations;
        VerifyExecutionModeLimits();

        if (&limit == &profilingInterpreter0Limit ||
            (!CONFIG_FLAG(NewSimpleJit) && &limit == &simpleJitLimit) ||
            &limit == &profilingInterpreter1Limit)
        {
            const uint16 newCommittedProfiledIterations = committedProfiledIterations + clampedExecutedIterations;
            committedProfiledIterations =
                newCommittedProfiledIterations >= committedProfiledIterations ? newCommittedProfiledIterations : UINT16_MAX;
        }
    }